

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fout.cpp
# Opt level: O1

void __thiscall
spatial_region::fout_by_yzplane(spatial_region *this,ofstream *pfout,int i,openmode mode)

{
  ostream *poVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  
  if ((mode & ~_S_app) == (_S_out|_S_bin)) {
    write_binary_yzplane<cellb>(pfout,&this->cb,getby,i,this->ny,this->nz);
    return;
  }
  if ((mode & ~_S_app) == _S_out) {
    if (0 < this->ny) {
      lVar3 = 0;
      do {
        if (0 < this->nz) {
          lVar2 = 8;
          lVar4 = 0;
          do {
            poVar1 = std::ostream::_M_insert<double>
                               (*(double *)
                                 ((long)&(this->cb).p._M_t.
                                         super___uniq_ptr_impl<cellb_**,_std::default_delete<cellb_**[]>_>
                                         ._M_t.
                                         super__Tuple_impl<0UL,_cellb_***,_std::default_delete<cellb_**[]>_>
                                         .super__Head_base<0UL,_cellb_***,_false>._M_head_impl[i]
                                         [lVar3]->bx + lVar2));
            std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
            lVar4 = lVar4 + 1;
            lVar2 = lVar2 + 0x18;
          } while (lVar4 < this->nz);
        }
        lVar3 = lVar3 + 1;
      } while (lVar3 < this->ny);
    }
    return;
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,"fout_by_yzplane: ERROR: wrong mode",0x22);
  std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x30);
  std::ostream::put(-0x30);
  std::ostream::flush();
  return;
}

Assistant:

void spatial_region::fout_by_yzplane(ofstream* pfout, int i, ios_base::openmode
        mode)
{
    if (is_mode_non_binary(mode)) {
        for(int j=0;j<ny;j++) {
            for(int k=0;k<nz;k++)
                (*pfout)<<cb[i][j][k].by<<"\n";
        }
    } else if (is_mode_binary(mode)) {
        write_binary_yzplane<cellb>(pfout, cb, getby, i, ny, nz);
    } else {
        cerr << "fout_by_yzplane: ERROR: wrong mode" << endl;
    }
}